

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_psubw_mips(uint64_t fs,uint64_t ft)

{
  int *piVar1;
  long lVar2;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    piVar1 = (int *)((long)&vs + lVar2 * 4);
    *piVar1 = *piVar1 - *(int *)((long)&vt + lVar2 * 4);
  }
  return vs.d;
}

Assistant:

uint64_t helper_psubw(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 2; ++i) {
        vs.uw[i] -= vt.uw[i];
    }
    return vs.d;
}